

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

void __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::splitFallback(BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
                *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  undefined1 auVar1 [16];
  PrimRefVector pmVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  undefined8 unaff_RBP;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  BBox1f *pBVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  pmVar2 = set->prims;
  uVar3 = (set->super_PrimInfoMB).object_range._begin;
  uVar4 = (set->super_PrimInfoMB).object_range._end;
  uVar7 = uVar3 + uVar4 + 1 >> 1;
  local_b8 = SUB6416(ZEXT464(0x3f800000),0);
  local_c8 = ZEXT816(0x3f80000000000000);
  local_d8.m128[2] = INFINITY;
  local_d8._0_8_ = 0x7f8000007f800000;
  local_d8.m128[3] = INFINITY;
  aVar19.m128[2] = -INFINITY;
  aVar19._0_8_ = 0xff800000ff800000;
  aVar19.m128[3] = -INFINITY;
  lVar5 = uVar7 - uVar3;
  if (uVar7 < uVar3 || lVar5 == 0) {
    uVar11 = 0;
    sVar8 = 0;
    auVar26._8_4_ = 0x7f800000;
    auVar26._0_8_ = 0x7f8000007f800000;
    auVar26._12_4_ = 0x7f800000;
    auVar21 = ZEXT816(0x3f80000000000000);
    auVar23 = SUB6416(ZEXT464(0x3f800000),0);
    aVar22 = aVar19;
    auVar16 = auVar26;
    auVar25 = auVar26;
    aVar28 = aVar19;
    aVar20 = aVar19;
  }
  else {
    pBVar12 = &pmVar2->items[uVar3].time_range;
    auVar24 = ZEXT464(0x3f800000);
    auVar21 = ZEXT816(0x3f80000000000000);
    aVar22.m128[2] = -INFINITY;
    aVar22._0_8_ = 0xff800000ff800000;
    aVar22.m128[3] = -INFINITY;
    auVar25._8_4_ = 0x7f800000;
    auVar25._0_8_ = 0x7f8000007f800000;
    auVar25._12_4_ = 0x7f800000;
    sVar8 = 0;
    uVar9 = 0;
    aVar20 = aVar22;
    auVar16 = auVar25;
    aVar28 = aVar22;
    auVar26 = auVar25;
    do {
      auVar23 = *(undefined1 (*) [16])&pBVar12[-8].lower;
      auVar18 = *(undefined1 (*) [16])(pBVar12 + -6);
      auVar1 = *(undefined1 (*) [16])(pBVar12 + -4);
      auVar13 = *(undefined1 (*) [16])(pBVar12 + -2);
      auVar17._0_4_ =
           auVar1._0_4_ * 0.5 + auVar23._0_4_ * 0.5 + auVar13._0_4_ * 0.5 + auVar18._0_4_ * 0.5;
      auVar17._4_4_ =
           auVar1._4_4_ * 0.5 + auVar23._4_4_ * 0.5 + auVar13._4_4_ * 0.5 + auVar18._4_4_ * 0.5;
      auVar17._8_4_ =
           auVar1._8_4_ * 0.5 + auVar23._8_4_ * 0.5 + auVar13._8_4_ * 0.5 + auVar18._8_4_ * 0.5;
      auVar17._12_4_ =
           auVar1._12_4_ * 0.5 + auVar23._12_4_ * 0.5 + auVar13._12_4_ * 0.5 + auVar18._12_4_ * 0.5;
      auVar16 = vminps_avx(auVar16,auVar23);
      aVar22.m128 = (__m128)vmaxps_avx(aVar22.m128,auVar18);
      auVar25 = vminps_avx(auVar25,auVar1);
      aVar20.m128 = (__m128)vmaxps_avx(aVar20.m128,auVar13);
      auVar26 = vminps_avx(auVar26,auVar17);
      auVar13._8_8_ = 0;
      auVar13._0_4_ = pBVar12->lower;
      auVar13._4_4_ = pBVar12->upper;
      auVar23 = auVar24._0_16_;
      auVar18 = vcmpps_avx(auVar23,auVar13,1);
      auVar1 = vinsertps_avx(auVar23,auVar13,0x50);
      auVar23 = vblendps_avx(auVar13,auVar23,2);
      auVar23 = vblendvps_avx(auVar23,auVar1,auVar18);
      auVar24 = ZEXT1664(auVar23);
      aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,auVar17);
      sVar8 = sVar8 + (uint)pBVar12[-3].upper;
      uVar10 = (ulong)(uint)pBVar12[-1].upper;
      uVar11 = uVar10;
      if (uVar10 < uVar9) {
        uVar11 = uVar9;
      }
      unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar9 < uVar10);
      auVar18 = vpshufd_avx(ZEXT416((uint)unaff_RBP),0x50);
      auVar18 = vpslld_avx(auVar18,0x1f);
      auVar21 = vblendvps_avx(auVar21,auVar13,auVar18);
      pBVar12 = pBVar12 + 10;
      lVar5 = lVar5 + -1;
      uVar9 = uVar11;
    } while (lVar5 != 0);
  }
  lVar5 = uVar4 - uVar7;
  if (uVar4 < uVar7 || lVar5 == 0) {
    uVar9 = 0;
    sVar6 = 0;
    aVar30.m128[2] = INFINITY;
    aVar30._0_8_ = 0x7f8000007f800000;
    aVar30.m128[3] = INFINITY;
    aVar32 = aVar30;
    aVar31 = aVar19;
    aVar29 = aVar19;
  }
  else {
    pBVar12 = &pmVar2->items[uVar7].time_range;
    local_b8 = SUB6416(ZEXT464(0x3f800000),0);
    local_c8 = ZEXT816(0x3f80000000000000);
    aVar29.m128[2] = -INFINITY;
    aVar29._0_8_ = 0xff800000ff800000;
    aVar29.m128[3] = -INFINITY;
    aVar30.m128[2] = INFINITY;
    aVar30._0_8_ = 0x7f8000007f800000;
    aVar30.m128[3] = INFINITY;
    sVar6 = 0;
    uVar10 = 0;
    aVar19 = aVar29;
    aVar31 = aVar29;
    aVar32 = aVar30;
    local_d8 = aVar30;
    do {
      auVar18 = *(undefined1 (*) [16])&pBVar12[-8].lower;
      auVar1 = *(undefined1 (*) [16])(pBVar12 + -6);
      auVar13 = *(undefined1 (*) [16])(pBVar12 + -4);
      auVar17 = *(undefined1 (*) [16])(pBVar12 + -2);
      auVar27._0_4_ =
           auVar13._0_4_ * 0.5 + auVar18._0_4_ * 0.5 + auVar1._0_4_ * 0.5 + auVar17._0_4_ * 0.5;
      auVar27._4_4_ =
           auVar13._4_4_ * 0.5 + auVar18._4_4_ * 0.5 + auVar1._4_4_ * 0.5 + auVar17._4_4_ * 0.5;
      auVar27._8_4_ =
           auVar13._8_4_ * 0.5 + auVar18._8_4_ * 0.5 + auVar1._8_4_ * 0.5 + auVar17._8_4_ * 0.5;
      auVar27._12_4_ =
           auVar13._12_4_ * 0.5 + auVar18._12_4_ * 0.5 + auVar1._12_4_ * 0.5 + auVar17._12_4_ * 0.5;
      aVar30.m128 = (__m128)vminps_avx(aVar30.m128,auVar18);
      aVar19.m128 = (__m128)vmaxps_avx(aVar19.m128,auVar1);
      aVar32.m128 = (__m128)vminps_avx(aVar32.m128,auVar13);
      aVar31.m128 = (__m128)vmaxps_avx(aVar31.m128,auVar17);
      local_d8.m128 = (__m128)vminps_avx(local_d8.m128,auVar27);
      auVar14._8_8_ = 0;
      auVar14._0_4_ = pBVar12->lower;
      auVar14._4_4_ = pBVar12->upper;
      auVar1 = vcmpps_avx(local_b8,auVar14,1);
      auVar13 = vinsertps_avx(local_b8,auVar14,0x50);
      auVar18 = vblendps_avx(auVar14,local_b8,2);
      local_b8 = vblendvps_avx(auVar18,auVar13,auVar1);
      aVar29.m128 = (__m128)vmaxps_avx(aVar29.m128,auVar27);
      sVar6 = sVar6 + (uint)pBVar12[-3].upper;
      uVar9 = (ulong)(uint)pBVar12[-1].upper;
      unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar10 < uVar9);
      auVar18 = vpshufd_avx(ZEXT416((uint)unaff_RBP),0x50);
      auVar18 = vpslld_avx(auVar18,0x1f);
      if (uVar9 < uVar10) {
        uVar9 = uVar10;
      }
      local_c8 = vblendvps_avx(local_c8,auVar14,auVar18);
      pBVar12 = pBVar12 + 10;
      lVar5 = lVar5 + -1;
      uVar10 = uVar9;
    } while (lVar5 != 0);
  }
  auVar15._8_8_ = 0;
  auVar15._0_4_ = (set->super_PrimInfoMB).time_range.lower;
  auVar15._4_4_ = (set->super_PrimInfoMB).time_range.upper;
  auVar1 = vcmpps_avx(auVar23,auVar15,1);
  auVar18 = vblendps_avx(auVar15,auVar23,2);
  auVar23 = vinsertps_avx(auVar23,auVar15,0x50);
  auVar23 = vblendvps_avx(auVar23,auVar18,auVar1);
  *(undefined1 (*) [16])
   (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
   field_0.m128 = auVar16;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
  field_0 = aVar22;
  *(undefined1 (*) [16])
   (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
   field_0.m128 = auVar25;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
  field_0 = aVar20;
  local_48 = auVar26._0_8_;
  uStack_40 = auVar26._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0
       = local_48;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
           field_0 + 8) = uStack_40;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
       aVar28;
  (lset->super_PrimInfoMB).num_time_segments = sVar8;
  (lset->super_PrimInfoMB).max_num_time_segments = uVar11;
  auVar23 = vmovlhps_avx(auVar21,auVar23);
  (lset->super_PrimInfoMB).max_time_range.lower = (float)(int)auVar23._0_8_;
  (lset->super_PrimInfoMB).max_time_range.upper = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (lset->super_PrimInfoMB).time_range.lower = (float)(int)auVar23._8_8_;
  (lset->super_PrimInfoMB).time_range.upper = (float)(int)((ulong)auVar23._8_8_ >> 0x20);
  lset->prims = pmVar2;
  (lset->super_PrimInfoMB).object_range._begin = uVar3;
  (lset->super_PrimInfoMB).object_range._end = uVar7;
  auVar16._8_8_ = 0;
  auVar16._0_4_ = (set->super_PrimInfoMB).time_range.lower;
  auVar16._4_4_ = (set->super_PrimInfoMB).time_range.upper;
  auVar21 = vcmpps_avx(local_b8,auVar16,1);
  auVar23 = vblendps_avx(auVar16,local_b8,2);
  auVar16 = vinsertps_avx(local_b8,auVar16,0x50);
  auVar23 = vblendvps_avx(auVar16,auVar23,auVar21);
  pmVar2 = set->prims;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
  field_0 = aVar30;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
  field_0 = aVar19;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
  field_0 = aVar32;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
  field_0 = aVar31;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0
       = local_d8._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
           field_0 + 8) = local_d8._8_8_;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
       aVar29;
  auVar23 = vmovlhps_avx(local_c8,auVar23);
  (rset->super_PrimInfoMB).num_time_segments = sVar6;
  (rset->super_PrimInfoMB).max_num_time_segments = uVar9;
  (rset->super_PrimInfoMB).max_time_range.lower = (float)(int)auVar23._0_8_;
  (rset->super_PrimInfoMB).max_time_range.upper = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (rset->super_PrimInfoMB).time_range.lower = (float)(int)auVar23._8_8_;
  (rset->super_PrimInfoMB).time_range.upper = (float)(int)((ulong)auVar23._8_8_ >> 0x20);
  rset->prims = pmVar2;
  (rset->super_PrimInfoMB).object_range._begin = uVar7;
  (rset->super_PrimInfoMB).object_range._end = uVar4;
  return;
}

Assistant:

void splitFallback(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            mvector<PrimRefMB>& prims = *set.prims;

            const size_t begin = set.begin();
            const size_t end   = set.end();
            const size_t center = (begin + end + 1) / 2;

            PrimInfoMB linfo = empty;
            for (size_t i=begin; i<center; i++)
              linfo.add_primref(prims[i]);

            PrimInfoMB rinfo = empty;
            for (size_t i=center; i<end; i++)
              rinfo.add_primref(prims[i]);

            new (&lset) SetMB(linfo,set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(rinfo,set.prims,range<size_t>(center,end  ),set.time_range);
          }